

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O1

void __thiscall
MetaDCEGraph::scanWebAssembly()::Scanner::handleGlobal(wasm::Name_(void *this,Name name)

{
  pointer *ppNVar1;
  MetaDCEGraph *this_00;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  iterator __position;
  char *pcVar2;
  Name name_00;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  Name NVar6;
  string_view local_48;
  undefined1 local_38 [8];
  Name name_local;
  Name dceName;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  NVar6.super_IString.str._M_str = name.super_IString.str._M_len;
  if (*(long *)((long)this + 0xf8) != 0) {
    name_local.super_IString.str._M_str = (char *)0x0;
    NVar6.super_IString.str._M_len = *(size_t *)((long)this + 0x100);
    local_38 = (undefined1  [8])NVar6.super_IString.str._M_str;
    lVar3 = wasm::Module::getGlobal(NVar6);
    this_00 = *(MetaDCEGraph **)((long)this + 0x108);
    if (*(long *)(lVar3 + 0x20) == 0) {
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this_00->globalToDCENode,(key_type *)local_38);
    }
    else {
      name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)local_38;
      local_48 = (string_view)getGlobalImportId(this_00,name_00);
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this_00->importIdToDCENode,(key_type *)&local_48);
    }
    name_local.super_IString.str._M_str = (char *)(pmVar4->super_IString).str._M_len;
    pcVar2 = (pmVar4->super_IString).str._M_str;
    this_01 = *(_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                **)((long)this + 0x108);
    pmVar4 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(this_01 + 0xa8),*(key_type **)((long)this + 0xf8));
    pmVar5 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](this_01,pmVar4);
    __position._M_current =
         (pmVar5->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pmVar5->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pmVar5->reaches,__position,
                 (Name *)&name_local.super_IString.str._M_str);
    }
    else {
      ((__position._M_current)->super_IString).str._M_len =
           (size_t)name_local.super_IString.str._M_str;
      ((__position._M_current)->super_IString).str._M_str = pcVar2;
      ppNVar1 = &(pmVar5->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
  }
  return;
}

Assistant:

void handleGlobal(Name name) {
        if (!getFunction()) {
          return; // non-function stuff (initializers) are handled separately
        }
        Name dceName;
        if (!getModule()->getGlobal(name)->imported()) {
          // its a global
          dceName = parent->globalToDCENode[name];
        } else {
          // it's an import.
          dceName = parent->importIdToDCENode[parent->getGlobalImportId(name)];
        }
        parent->nodes[parent->functionToDCENode[getFunction()->name]]
          .reaches.push_back(dceName);
      }